

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>
wabt::MakeUnique<wabt::GlobalImport>(void)

{
  GlobalImport *this;
  __uniq_ptr_data<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>,_true,_true> in_RDI;
  string_view local_20;
  
  this = (GlobalImport *)operator_new(0x90);
  string_view::string_view(&local_20);
  GlobalImport::GlobalImport(this,local_20);
  std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>::
  unique_ptr<std::default_delete<wabt::GlobalImport>,void>
            ((unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>> *)
             in_RDI.
             super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
             super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>,_true,_true>)
         (tuple<wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>)
         in_RDI.super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>
         .super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}